

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O0

void __thiscall MyRTPSession::OnRemoveSource(MyRTPSession *this,RTPSourceData *dat)

{
  bool bVar1;
  uint16_t uVar2;
  RTPAddress *pRVar3;
  RTPIPv4Address *this_00;
  ostream *poVar4;
  char *__s;
  allocator<char> local_7d;
  in_addr_t local_7c;
  string local_78 [32];
  in_addr local_58;
  in_addr inaddr;
  undefined1 local_48 [8];
  RTPIPv4Address dest;
  RTPIPv4Address *addr_1;
  RTPIPv4Address *addr;
  uint16_t port;
  uint32_t ip;
  RTPSourceData *dat_local;
  MyRTPSession *this_local;
  
  bVar1 = jrtplib::RTPSourceData::IsOwnSSRC(dat);
  if ((!bVar1) && (bVar1 = jrtplib::RTPSourceData::ReceivedBYE(dat), !bVar1)) {
    pRVar3 = jrtplib::RTPSourceData::GetRTPDataAddress(dat);
    if (pRVar3 == (RTPAddress *)0x0) {
      pRVar3 = jrtplib::RTPSourceData::GetRTCPDataAddress(dat);
      if (pRVar3 == (RTPAddress *)0x0) {
        return;
      }
      dest._16_8_ = jrtplib::RTPSourceData::GetRTCPDataAddress(dat);
      addr._4_4_ = jrtplib::RTPIPv4Address::GetIP((RTPIPv4Address *)dest._16_8_);
      uVar2 = jrtplib::RTPIPv4Address::GetPort((RTPIPv4Address *)dest._16_8_);
      addr._2_2_ = uVar2 - 1;
    }
    else {
      this_00 = (RTPIPv4Address *)jrtplib::RTPSourceData::GetRTPDataAddress(dat);
      addr._4_4_ = jrtplib::RTPIPv4Address::GetIP(this_00);
      addr._2_2_ = jrtplib::RTPIPv4Address::GetPort(this_00);
    }
    jrtplib::RTPIPv4Address::RTPIPv4Address((RTPIPv4Address *)local_48,addr._4_4_,addr._2_2_,false);
    jrtplib::RTPSession::DeleteDestination(&this->super_RTPSession,(RTPAddress *)local_48);
    local_58.s_addr = htonl(addr._4_4_);
    poVar4 = std::operator<<((ostream *)&std::cout,"Deleting destination ");
    local_7c = local_58.s_addr;
    __s = inet_ntoa(local_58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_78,__s,&local_7d);
    poVar4 = std::operator<<(poVar4,local_78);
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,addr._2_2_);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_7d);
    jrtplib::RTPIPv4Address::~RTPIPv4Address((RTPIPv4Address *)local_48);
  }
  return;
}

Assistant:

void OnRemoveSource(RTPSourceData *dat)
	{
		if (dat->IsOwnSSRC())
			return;
		if (dat->ReceivedBYE())
			return;
		
		uint32_t ip;
		uint16_t port;
		
		if (dat->GetRTPDataAddress() != 0)
		{
			const RTPIPv4Address *addr = (const RTPIPv4Address *)(dat->GetRTPDataAddress());
			ip = addr->GetIP();
			port = addr->GetPort();
		}
		else if (dat->GetRTCPDataAddress() != 0)
		{
			const RTPIPv4Address *addr = (const RTPIPv4Address *)(dat->GetRTCPDataAddress());
			ip = addr->GetIP();
			port = addr->GetPort()-1;
		}
		else
			return;
		
		RTPIPv4Address dest(ip,port);
		DeleteDestination(dest);
		
		struct in_addr inaddr;
		inaddr.s_addr = htonl(ip);
		std::cout << "Deleting destination " << std::string(inet_ntoa(inaddr)) << ":" << port << std::endl;
	}